

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::fixBlockUniformOffsets
          (TParseContext *this,TQualifier *qualifier,TTypeList *typeList)

{
  pointer pTVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  int powerOf2;
  TSourceLoc *pTVar8;
  ulong uVar9;
  int offset;
  TParseContext *local_48;
  TQualifier *local_40;
  int memberSize;
  int dummyStride;
  long lVar6;
  
  if (((((*(ulong *)&qualifier->field_0x8 >> 0x2b & 1) != 0) ||
       (((uint)*(ulong *)&qualifier->field_0x8 & 0x7f) - 5 < 3)) &&
      (uVar3 = (byte)qualifier->field_0x10 & 0xf, uVar3 < 6)) && ((0x2cU >> uVar3 & 1) != 0)) {
    offset = 0;
    uVar3 = 0;
    local_48 = this;
    local_40 = qualifier;
    while( true ) {
      uVar9 = (ulong)uVar3;
      pTVar1 = (typeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(typeList->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ).
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 5) <= uVar9)
      break;
      iVar4 = (*(pTVar1[uVar9].type)->_vptr_TType[10])();
      lVar6 = CONCAT44(extraout_var,iVar4);
      pTVar1 = (typeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar4 = (*(pTVar1[uVar9].type)->_vptr_TType[10])();
      uVar7 = *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8);
      if (uVar7 < 0x2000000000000000) {
        uVar7 = *(ulong *)&local_40->field_0x8;
      }
      iVar5 = TIntermediate::getMemberAlignment
                        ((typeList->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ).
                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar9].type,&memberSize,
                         &dummyStride,(byte)local_40->field_0x10 & 0xf,
                         (uVar7 & 0xe000000000000000) == 0x2000000000000000);
      iVar4 = offset;
      if (*(int *)(lVar6 + 0x14) != -1) {
        pTVar8 = &pTVar1[uVar9].loc;
        bVar2 = IsMultipleOfPow2<int>(*(int *)(lVar6 + 0x14),iVar5);
        if (!bVar2) {
          (*(local_48->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (local_48,pTVar8,"must be a multiple of the member\'s alignment","offset",
                     "(layout offset = %d | member alignment = %d)",(ulong)*(uint *)(lVar6 + 0x14),
                     iVar5);
        }
        iVar4 = *(int *)(lVar6 + 0x14);
        if ((local_48->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0) {
          if (iVar4 < offset) {
            (*(local_48->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (local_48,pTVar8,"cannot lie in previous members","offset","");
            iVar4 = *(int *)(lVar6 + 0x14);
          }
          if (iVar4 < offset) {
            iVar4 = offset;
          }
        }
      }
      offset = iVar4;
      iVar4 = *(int *)(lVar6 + 0x18);
      powerOf2 = iVar4;
      if (iVar4 < iVar5) {
        powerOf2 = iVar5;
      }
      if (iVar4 == -1) {
        powerOf2 = iVar5;
      }
      RoundToPow2<int>(&offset,powerOf2);
      iVar4 = offset;
      iVar5 = (*((typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar9].type)->_vptr_TType[10])();
      *(int *)(CONCAT44(extraout_var_01,iVar5) + 0x14) = iVar4;
      offset = offset + memberSize;
      uVar3 = uVar3 + 1;
    }
  }
  return;
}

Assistant:

void TParseContext::fixBlockUniformOffsets(TQualifier& qualifier, TTypeList& typeList)
{
    if (!storageCanHaveLayoutInBlock(qualifier.storage) && !qualifier.isTaskMemory())
        return;
    if (qualifier.layoutPacking != ElpStd140 && qualifier.layoutPacking != ElpStd430 && qualifier.layoutPacking != ElpScalar)
        return;

    int offset = 0;
    int memberSize;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;

        // "When align is applied to an array, it effects only the start of the array, not the array's internal stride."

        // modify just the children's view of matrix layout, if there is one for this member
        TLayoutMatrix subMatrixLayout = typeList[member].type->getQualifier().layoutMatrix;
        int dummyStride;
        int memberAlignment = intermediate.getMemberAlignment(*typeList[member].type, memberSize, dummyStride, qualifier.layoutPacking,
                                                              subMatrixLayout != ElmNone ? subMatrixLayout == ElmRowMajor : qualifier.layoutMatrix == ElmRowMajor);
        if (memberQualifier.hasOffset()) {
            // "The specified offset must be a multiple
            // of the base alignment of the type of the block member it qualifies, or a compile-time error results."
            if (! IsMultipleOfPow2(memberQualifier.layoutOffset, memberAlignment))
                error(memberLoc, "must be a multiple of the member's alignment", "offset",
                    "(layout offset = %d | member alignment = %d)", memberQualifier.layoutOffset, memberAlignment);

            // GLSL: "It is a compile-time error to specify an offset that is smaller than the offset of the previous
            // member in the block or that lies within the previous member of the block"
            if (spvVersion.spv == 0) {
                if (memberQualifier.layoutOffset < offset)
                    error(memberLoc, "cannot lie in previous members", "offset", "");

                // "The offset qualifier forces the qualified member to start at or after the specified
                // integral-constant expression, which will be its byte offset from the beginning of the buffer.
                // "The actual offset of a member is computed as
                // follows: If offset was declared, start with that offset, otherwise start with the next available offset."
                offset = std::max(offset, memberQualifier.layoutOffset);
            } else {
                // TODO: Vulkan: "It is a compile-time error to have any offset, explicit or assigned,
                // that lies within another member of the block."

                offset = memberQualifier.layoutOffset;
            }
        }

        // "The actual alignment of a member will be the greater of the specified align alignment and the standard
        // (e.g., std140) base alignment for the member's type."
        if (memberQualifier.hasAlign())
            memberAlignment = std::max(memberAlignment, memberQualifier.layoutAlign);

        // "If the resulting offset is not a multiple of the actual alignment,
        // increase it to the first offset that is a multiple of
        // the actual alignment."
        RoundToPow2(offset, memberAlignment);
        typeList[member].type->getQualifier().layoutOffset = offset;
        offset += memberSize;
    }
}